

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Type * __thiscall
soul::heart::Parser::parseBoundedIntType(Type *__return_storage_ptr__,Parser *this,bool isWrap)

{
  bool bVar1;
  Type local_98;
  BoundedIntSize local_80;
  BoundedIntSize boundedSize;
  CompileMessage local_70;
  char *local_38;
  long local_30;
  int64_t size;
  byte local_19;
  Parser *pPStack_18;
  bool isWrap_local;
  Parser *this_local;
  
  size = (long)"<<" + 1;
  local_19 = isWrap;
  pPStack_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4aecc4);
  local_30 = parseLiteralInt(this);
  local_38 = ">";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4d4b9a);
  bVar1 = Type::isLegalBoundedIntSize<long>(local_30);
  if (!bVar1) {
    Errors::illegalSize<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_70);
    CompileMessage::~CompileMessage(&local_70);
  }
  local_80 = (BoundedIntSize)local_30;
  bVar1 = (local_19 & 1) == 0;
  if (bVar1) {
    Type::createClampedInt(&local_98,local_80);
  }
  else {
    Type::createWrappedInt(&local_98,local_80);
  }
  parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_98);
  if (bVar1) {
    Type::~Type(&local_98);
  }
  else {
    Type::~Type(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseBoundedIntType (bool isWrap)
    {
        expect (HEARTOperator::lessThan);
        auto size = parseLiteralInt();
        expect (HEARTOperator::greaterThan);

        if (! Type::isLegalBoundedIntSize (size))
            throwError (Errors::illegalSize());

        auto boundedSize = static_cast<Type::BoundedIntSize> (size);
        return parseArrayTypeSuffixes (isWrap ? Type::createWrappedInt (boundedSize)
                                              : Type::createClampedInt (boundedSize));
    }